

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward
          (Convolution_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Layer *pLVar1;
  bool bVar2;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  int in_stack_fffffffffffffdac;
  Mat *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  Mat *in_stack_fffffffffffffdc8;
  Mat *pMVar3;
  ParamDict *in_stack_fffffffffffffdd0;
  Option *in_stack_fffffffffffffde0;
  Mat *pMVar4;
  Mat *in_stack_fffffffffffffde8;
  Mat *in_stack_fffffffffffffdf0;
  Mat *local_1e8;
  undefined1 local_1b8 [16];
  Mat local_1a8 [2];
  undefined1 auStack_118 [24];
  Layer *local_100;
  const_reference local_f8;
  Mat local_f0;
  undefined4 local_a8;
  Mat local_98;
  int local_4c;
  int local_48;
  int local_44;
  reference local_40;
  const_reference local_38;
  const_reference local_30;
  undefined8 local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  local_44 = local_38->w;
  local_48 = local_38->h;
  local_4c = local_38->c * local_38->elempack;
  ncnn::Mat::Mat(&local_98);
  flatten(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffdb0);
  if (bVar2) {
    local_4 = -100;
    local_a8 = 1;
    goto LAB_001d1061;
  }
  local_98.w = local_98.w * local_98.elempack;
  local_98.elemsize = local_98.elemsize / (ulong)(long)local_98.elempack;
  local_98.elempack = 1;
  ncnn::Mat::Mat(&local_f0);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
LAB_001d0ad0:
    local_100 = create_layer(in_stack_fffffffffffffdbc);
    ParamDict::ParamDict(in_stack_fffffffffffffdd0);
    ParamDict::set((ParamDict *)(auStack_118 + 8),0,local_4c);
    ParamDict::set((ParamDict *)(auStack_118 + 8),1,local_44);
    ParamDict::set((ParamDict *)(auStack_118 + 8),0xb,local_48);
    ParamDict::set((ParamDict *)(auStack_118 + 8),2,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc));
    ParamDict::set((ParamDict *)(auStack_118 + 8),0x15,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
    ParamDict::set((ParamDict *)(auStack_118 + 8),3,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4));
    ParamDict::set((ParamDict *)(auStack_118 + 8),0x1f,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8));
    ParamDict::set((ParamDict *)(auStack_118 + 8),4,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec));
    ParamDict::set((ParamDict *)(auStack_118 + 8),0xf,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0));
    ParamDict::set((ParamDict *)(auStack_118 + 8),0xe,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4));
    ParamDict::set((ParamDict *)(auStack_118 + 8),0x10,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
    ParamDict::set((ParamDict *)(auStack_118 + 8),0x12,
                   *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc));
    ParamDict::set((ParamDict *)(auStack_118 + 8),5,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
    ParamDict::set((ParamDict *)(auStack_118 + 8),6,local_98.w);
    ParamDict::set((ParamDict *)(auStack_118 + 8),8,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108));
    ParamDict::set((ParamDict *)(auStack_118 + 8),9,
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c));
    ParamDict::set((ParamDict *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,(Mat *)0x1d0d89)
    ;
    (*local_100->_vptr_Layer[2])(local_100,auStack_118 + 8);
    local_1e8 = local_1a8;
    do {
      ncnn::Mat::Mat(local_1e8);
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 != (Mat *)auStack_118);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0);
    pLVar1 = local_100;
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    (*pLVar1->_vptr_Layer[3])(pLVar1,local_1b8);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffdb0);
    (*local_100->_vptr_Layer[4])(local_100,local_28);
    (*local_100->_vptr_Layer[7])(local_100,local_30,local_40,local_28);
    (*local_100->_vptr_Layer[5])(local_100,local_28);
    if (local_100 != (Layer *)0x0) {
      (*local_100->_vptr_Layer[1])();
    }
    local_4 = 0;
    local_a8 = 1;
    pMVar4 = local_1a8;
    pMVar3 = (Mat *)auStack_118;
    do {
      pMVar3 = pMVar3 + -1;
      ncnn::Mat::~Mat((Mat *)0x1d0fd0);
    } while (pMVar3 != pMVar4);
    ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffdb0);
  }
  else {
    local_f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
    flatten(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffdb0);
    if (!bVar2) {
      local_f0.w = local_f0.elempack * local_f0.w;
      local_f0.elemsize = local_f0.elemsize / (ulong)(long)local_f0.elempack;
      local_f0.elempack = 1;
      goto LAB_001d0ad0;
    }
    local_4 = -100;
    local_a8 = 1;
  }
  ncnn::Mat::~Mat((Mat *)0x1d1050);
LAB_001d1061:
  ncnn::Mat::~Mat((Mat *)0x1d106e);
  return local_4;
}

Assistant:

int Convolution_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(21, dilation_h);
    pd.set(3, stride_w);
    pd.set(31, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(8, int8_scale_term);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}